

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE *rghHandlesToReference,
          DWORD dwHandleCount,CAllowedObjectTypes *paot,DWORD dwRightsRequired,IPalObject **rgpobjs)

{
  PAL_ERROR PVar1;
  DWORD *pdwRightsGranted;
  DWORD dwRightsGranted_00;
  uint uVar2;
  ulong uVar3;
  PCRITICAL_SECTION pCriticalSection;
  DWORD local_54;
  CAllowedObjectTypes *pCStack_50;
  DWORD dwRightsGranted;
  PCRITICAL_SECTION local_48;
  CPalThread *local_40;
  IPalObject *local_38;
  IPalObject *pobj;
  ulong uVar4;
  
  local_38 = (IPalObject *)0x0;
  pCStack_50 = paot;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a3);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (rghHandlesToReference == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a4);
    fprintf(_stderr,"Expression: NULL != rghHandlesToReference\n");
  }
  if (dwHandleCount == 0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a5);
    fprintf(_stderr,"Expression: 0 < dwHandleCount\n");
  }
  if (pCStack_50 == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a6);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (rgpobjs == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a7);
    fprintf(_stderr,"Expression: NULL != rgpobjs\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    pCriticalSection = &(this->m_HandleManager).m_csLock;
    InternalEnterCriticalSection(pthr,pCriticalSection);
    if (dwHandleCount == 0) {
      uVar2 = 0;
      PVar1 = 0;
    }
    else {
      uVar3 = 0;
      local_48 = pCriticalSection;
      local_40 = pthr;
      do {
        pdwRightsGranted = &local_54;
        PVar1 = CSimpleHandleManager::GetObjectFromHandle
                          (&this->m_HandleManager,local_40,rghHandlesToReference[uVar3],
                           pdwRightsGranted,&local_38);
        if ((PVar1 == 0) &&
           (PVar1 = CheckObjectTypeAndRights
                              (local_38,pCStack_50,dwRightsGranted_00,(DWORD)pdwRightsGranted),
           PVar1 == 0)) {
          rgpobjs[uVar3] = local_38;
          local_38 = (IPalObject *)0x0;
        }
        uVar4 = uVar3;
      } while ((PVar1 == 0) &&
              (uVar3 = uVar3 + 1, uVar4 = (ulong)dwHandleCount, dwHandleCount != uVar3));
      uVar2 = (uint)uVar4;
      pthr = local_40;
      pCriticalSection = local_48;
    }
    InternalLeaveCriticalSection(pthr,pCriticalSection);
    if (PVar1 != 0) {
      if (uVar2 != 0) {
        uVar3 = (ulong)uVar2;
        do {
          (*rgpobjs[uVar3 - 1]->_vptr_IPalObject[8])(rgpobjs[uVar3 - 1],pthr);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (local_38 != (IPalObject *)0x0) {
        (*local_38->_vptr_IPalObject[8])(local_38,pthr);
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray(
    CPalThread *pthr,
    HANDLE rghHandlesToReference[],
    DWORD dwHandleCount,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject *rgpobjs[]            // OUT (caller allocated)
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    DWORD dwRightsGranted;
    DWORD dw;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != rghHandlesToReference);
    _ASSERTE(0 < dwHandleCount);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != rgpobjs);

    ENTRY("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray "
        "(this=%p, pthr=%p, rghHandlesToReference=%p, dwHandleCount=%d, "
        "pAllowedTyped=%d, dwRightsRequired=%d, rgpobjs=%p)\n",
        this,
        pthr,
        rghHandlesToReference,
        dwHandleCount,
        paot,
        dwRightsRequired,
        rgpobjs
        );

    m_HandleManager.Lock(pthr);

    for (dw = 0; dw < dwHandleCount; dw += 1)
    {        
        palError = m_HandleManager.GetObjectFromHandle(
            pthr,
            rghHandlesToReference[dw],
            &dwRightsGranted,
            &pobj
            );

        if (NO_ERROR == palError)
        {
            palError = CheckObjectTypeAndRights(
                pobj,
                paot,
                dwRightsGranted,
                dwRightsRequired
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer reference to out array
                //

                rgpobjs[dw] = pobj;
                pobj = NULL;
            }
        }

        if (NO_ERROR != palError)
        {
            break;
        }
    }

    //
    // The handle manager lock must be released before releasing
    // any object references, as ReleaseReference will acquire
    // the object manager list lock (which needs to be acquired before
    // the handle manager lock)
    //

    m_HandleManager.Unlock(pthr);

    if (NO_ERROR != palError)
    {
        //
        // dw's current value is the failing index, so we want
        // to free from dw - 1.
        //
        
        while (dw > 0)
        {
            rgpobjs[--dw]->ReleaseReference(pthr);
        }

        if (NULL != pobj)
        {
            pobj->ReleaseReference(pthr);
        }
    }

    LOGEXIT("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray"
        " returns %d\n",
        palError
        );

    return palError;
}